

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall depspawn::internal::ThreadPool::launch_theads(ThreadPool *this)

{
  int iVar1;
  
  if (this->nthreads_in_use_ == 0) {
    return;
  }
  do {
    do {
    } while (this->ready_ != false);
  } while (this->count_ != 0);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  this->ready_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  std::condition_variable::notify_all();
  return;
}

Assistant:

void launch_theads()
  {
    if (nthreads_in_use_) {
      wait();
      {
        std::lock_guard<std::mutex> my_guard_lock(mutex_);
        ready_ = true;
      }
      cond_var_.notify_all();
    }
  }